

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O3

bool libwebm::Webm2Pes::WritePesPacket(VideoFrame *frame,PacketDataBuffer *packet_data)

{
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> frame_00;
  pointer puVar1;
  VideoFrame *pVVar2;
  bool bVar3;
  ulong uVar4;
  size_t raw_input_length;
  size_t sVar5;
  uint8_t *raw_input;
  Range *pRVar6;
  ulong uVar7;
  bool error;
  Ranges frame_ranges;
  BCMVHeader local_190;
  Ranges local_188;
  VideoFrame *local_170;
  Range *local_168;
  PesHeader local_160;
  
  frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (frame->buffer_).data._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>;
  if ((frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) ||
     (sVar5 = (frame->buffer_).length, sVar5 == 0)) {
    return false;
  }
  local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (Range *)0x0;
  local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (Range *)0x0;
  local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Range *)0x0;
  if (frame->codec_ == kVP9) {
    local_190.bcmv = (uint8_t  [4])((uint)local_190.bcmv & 0xffffff00);
    bVar3 = ParseVP9SuperFrameIndex
                      ((uint8_t *)
                       frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,sVar5,
                       &local_188,(bool *)&local_190);
    if (local_190.bcmv[0] != '\0') {
      WritePesPacket();
LAB_0010dfed:
      bVar3 = false;
      goto LAB_0010dfef;
    }
    if (!bVar3) {
      local_160.optional_header.marker.bits = (frame->buffer_).length;
      local_160.start_code[0] = '\0';
      local_160.start_code[1] = '\0';
      local_160.start_code[2] = '\0';
      local_160.start_code[3] = '\0';
      local_160.packet_length = 0;
      local_160._6_2_ = 0;
      if (local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::
        _M_realloc_insert<libwebm::Range>
                  (&local_188,
                   (iterator)
                   local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Range *)&local_160);
      }
      else {
        (local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
         super__Vector_impl_data._M_finish)->offset = 0;
        (local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
         super__Vector_impl_data._M_finish)->length = local_160.optional_header.marker.bits;
        local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  else {
    local_160.start_code[0] = '\0';
    local_160.start_code[1] = '\0';
    local_160.start_code[2] = '\0';
    local_160.start_code[3] = '\0';
    local_160.packet_length = 0;
    local_160._6_2_ = 0;
    local_160.optional_header.marker.bits = sVar5;
    std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::_M_realloc_insert<libwebm::Range>
              (&local_188,(iterator)0x0,(Range *)&local_160);
  }
  uVar4 = NanosecondsTo90KhzTicks(frame->nanosecond_pts_);
  local_160._0_6_ = 0xe0010000;
  local_160.optional_header.marker.bits = 2;
  local_160.optional_header.marker.num_bits = 2;
  local_160.optional_header.marker.index = '\0';
  local_160.optional_header.marker.shift = 6;
  local_160.optional_header.scrambling.bits = 0;
  local_160.optional_header.scrambling.num_bits = 2;
  local_160.optional_header.scrambling.index = '\0';
  local_160.optional_header.scrambling.shift = 4;
  local_160.optional_header.priority.bits = 0;
  local_160.optional_header.priority.num_bits = 1;
  local_160.optional_header.priority.index = '\0';
  local_160.optional_header.priority.shift = 3;
  local_160.optional_header.data_alignment.bits = 0;
  local_160.optional_header.data_alignment.num_bits = 1;
  local_160.optional_header.data_alignment.index = '\0';
  local_160.optional_header.data_alignment.shift = 2;
  local_160.optional_header.copyright.bits = 0;
  local_160.optional_header.copyright.num_bits = 1;
  local_160.optional_header.copyright.index = '\0';
  local_160.optional_header.copyright.shift = 1;
  local_160.optional_header.original.bits = 0;
  local_160.optional_header.original.num_bits = 1;
  local_160.optional_header.original.index = '\0';
  local_160.optional_header.original.shift = 0;
  local_160.optional_header.has_pts.bits = 1;
  local_160.optional_header.has_pts.num_bits = 1;
  bVar3 = true;
  local_160.optional_header.has_pts.index = '\x01';
  local_160.optional_header.has_pts.shift = 7;
  local_160.optional_header.has_dts.bits = 0;
  local_160.optional_header.has_dts.num_bits = 1;
  local_160.optional_header.has_dts.index = '\x01';
  local_160.optional_header.has_dts.shift = 6;
  local_160.optional_header.unused.bits = 0;
  local_160.optional_header.unused.num_bits = 6;
  local_160.optional_header.unused.index = '\x01';
  local_160.optional_header.unused.shift = 0;
  local_160.optional_header.remaining_size.bits = 6;
  local_160.optional_header.remaining_size.num_bits = 8;
  local_160.optional_header.remaining_size.index = '\x02';
  local_160.optional_header.remaining_size.shift = 0;
  local_160.optional_header.pts.num_bits = 0x28;
  local_160.optional_header.pts.index = '\x03';
  local_160.optional_header.pts.shift = 0;
  local_160.optional_header.stuffing_byte.bits = 0xff;
  local_160.optional_header.stuffing_byte.num_bits = 8;
  local_160.optional_header.stuffing_byte.index = '\b';
  local_160.optional_header.stuffing_byte.shift = 0;
  local_160.optional_header.fragment = false;
  local_160.optional_header.pts.bits =
       (ulong)(CONCAT14((char)uVar4 * '\x02',
                        CONCAT13((char)(uVar4 >> 7),
                                 CONCAT12((char)(uVar4 >> 0xe),
                                          CONCAT11((char)(uVar4 >> 0x16),(char)(uVar4 >> 0x1d))))) &
               0xffffffff0e | 0x10021) | 0x100000000;
  puVar1 = (packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_168 = local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pRVar6 = local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = frame;
  if (local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_170 = pVVar2;
      pVVar2 = local_170;
      uVar4 = pRVar6->length;
      uVar7 = uVar4 - 0x8000;
      if (uVar4 < 0x8000) {
        uVar7 = 0;
      }
      if ((local_170->buffer_).length < pRVar6->offset + uVar4) {
        WritePesPacket();
        goto LAB_0010dfed;
      }
      local_160.packet_length = ((short)uVar4 - (short)uVar7) + 10;
      bVar3 = PesHeader::Write(&local_160,true,packet_data);
      if (!bVar3) {
        WritePesPacket();
        goto LAB_0010dfed;
      }
      local_190.length = (uint32_t)pRVar6->length;
      builtin_memcpy(local_190.bcmv,"BCMV",4);
      bVar3 = BCMVHeader::Write(&local_190,packet_data);
      if (!bVar3) {
        WritePesPacket();
        goto LAB_0010dfed;
      }
      raw_input = (uint8_t *)
                  ((long)(pVVar2->buffer_).data._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false> + pRVar6->offset);
      sVar5 = pRVar6->length - uVar7;
      bVar3 = CopyAndEscapeStartCodes(raw_input,sVar5,packet_data);
      if (!bVar3) {
        WritePesPacket();
        goto LAB_0010dfed;
      }
      if (0x8000 < uVar4) {
        do {
          raw_input_length = 0x8000;
          if (uVar7 < 0x8000) {
            raw_input_length = uVar7;
          }
          local_160.packet_length = (uint16_t)raw_input_length;
          bVar3 = PesHeader::Write(&local_160,false,packet_data);
          if (!bVar3) {
            WritePesPacket();
            goto LAB_0010dfed;
          }
          bVar3 = CopyAndEscapeStartCodes(raw_input + sVar5,raw_input_length,packet_data);
          if (!bVar3) {
            WritePesPacket();
            goto LAB_0010dfed;
          }
          uVar7 = uVar7 - raw_input_length;
          sVar5 = sVar5 + raw_input_length;
        } while (uVar7 != 0);
      }
      pRVar6 = pRVar6 + 1;
      pVVar2 = local_170;
    } while (pRVar6 != local_168);
    bVar3 = true;
  }
LAB_0010dfef:
  if (local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
      super__Vector_impl_data._M_start != (Range *)0x0) {
    operator_delete(local_188.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool Webm2Pes::WritePesPacket(const VideoFrame& frame,
                              PacketDataBuffer* packet_data) {
  if (frame.buffer().data.get() == nullptr || frame.buffer().length < 1)
    return false;

  Ranges frame_ranges;
  if (frame.codec() == VideoFrame::kVP9) {
    bool error = false;
    const bool has_superframe_index =
        ParseVP9SuperFrameIndex(frame.buffer().data.get(),
                                frame.buffer().length, &frame_ranges, &error);
    if (error) {
      std::fprintf(stderr, "Webm2Pes: Superframe index parse failed.\n");
      return false;
    }
    if (has_superframe_index == false) {
      frame_ranges.push_back(Range(0, frame.buffer().length));
    }
  } else {
    frame_ranges.push_back(Range(0, frame.buffer().length));
  }

  const std::int64_t khz90_pts =
      NanosecondsTo90KhzTicks(frame.nanosecond_pts());
  PesHeader header;
  header.optional_header.SetPtsBits(khz90_pts);

  packet_data->clear();

  for (const Range& packet_payload_range : frame_ranges) {
    std::size_t extra_bytes = 0;
    if (packet_payload_range.length > kMaxPayloadSize) {
      extra_bytes = packet_payload_range.length - kMaxPayloadSize;
    }
    if (packet_payload_range.length + packet_payload_range.offset >
        frame.buffer().length) {
      std::fprintf(stderr, "Webm2Pes: Invalid frame length.\n");
      return false;
    }

    // First packet of new frame. Always include PTS and BCMV header.
    header.packet_length =
        packet_payload_range.length - extra_bytes + BCMVHeader::size();
    if (header.Write(true, packet_data) != true) {
      std::fprintf(stderr, "Webm2Pes: packet header write failed.\n");
      return false;
    }

    BCMVHeader bcmv_header(static_cast<uint32_t>(packet_payload_range.length));
    if (bcmv_header.Write(packet_data) != true) {
      std::fprintf(stderr, "Webm2Pes: BCMV write failed.\n");
      return false;
    }

    // Insert the payload at the end of |packet_data|.
    const std::uint8_t* const payload_start =
        frame.buffer().data.get() + packet_payload_range.offset;

    const std::size_t bytes_to_copy = packet_payload_range.length - extra_bytes;
    if (CopyAndEscapeStartCodes(payload_start, bytes_to_copy, packet_data) ==
        false) {
      fprintf(stderr, "Webm2Pes: Payload write failed.\n");
      return false;
    }

    std::size_t bytes_copied = bytes_to_copy;
    while (extra_bytes) {
      // Write PES packets for the remaining data, but omit the PTS and BCMV
      // header.
      const std::size_t extra_bytes_to_copy =
          std::min(kMaxPayloadSize, extra_bytes);
      extra_bytes -= extra_bytes_to_copy;
      header.packet_length = extra_bytes_to_copy;
      if (header.Write(false, packet_data) != true) {
        fprintf(stderr, "Webm2pes: fragment write failed.\n");
        return false;
      }

      const std::uint8_t* fragment_start = payload_start + bytes_copied;
      if (CopyAndEscapeStartCodes(fragment_start, extra_bytes_to_copy,
                                  packet_data) == false) {
        fprintf(stderr, "Webm2Pes: Payload write failed.\n");
        return false;
      }

      bytes_copied += extra_bytes_to_copy;
    }
  }

  return true;
}